

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::MILSpec::Value::MergeFrom(Value *this,Value *from)

{
  bool bVar1;
  ValueCase VVar2;
  LogMessage *other;
  ulong uVar3;
  Value *pVVar4;
  Arena *pAVar5;
  ValueType *this_00;
  ValueType *from_00;
  Value_ImmediateValue *this_01;
  Value_ImmediateValue *from_01;
  Value_BlobFileValue *this_02;
  Value_BlobFileValue *from_02;
  LogFinisher local_75;
  uint32_t cached_has_bits;
  byte local_61;
  LogMessage local_60;
  Value *local_28;
  Value *from_local;
  Value *this_local;
  Value *local_10;
  
  local_61 = 0;
  local_28 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/MIL.pb.cc"
               ,0x17fc);
    local_61 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_75,other);
  }
  if ((local_61 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
  }
  _internal_docstring_abi_cxx11_(local_28);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pVVar4 = (Value *)_internal_docstring_abi_cxx11_(local_28);
    this_local = pVVar4;
    local_10 = this;
    pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->docstring_,pVVar4,pAVar5);
  }
  bVar1 = _internal_has_type(local_28);
  if (bVar1) {
    this_00 = _internal_mutable_type(this);
    from_00 = _internal_type(local_28);
    ValueType::MergeFrom(this_00,from_00);
  }
  VVar2 = value_case(local_28);
  if (VVar2 != VALUE_NOT_SET) {
    if (VVar2 == kImmediateValue) {
      this_01 = _internal_mutable_immediatevalue(this);
      from_01 = _internal_immediatevalue(local_28);
      Value_ImmediateValue::MergeFrom(this_01,from_01);
    }
    else if (VVar2 == kBlobFileValue) {
      this_02 = _internal_mutable_blobfilevalue(this);
      from_02 = _internal_blobfilevalue(local_28);
      Value_BlobFileValue::MergeFrom(this_02,from_02);
    }
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_28->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Value::MergeFrom(const Value& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.Value)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (!from._internal_docstring().empty()) {
    _internal_set_docstring(from._internal_docstring());
  }
  if (from._internal_has_type()) {
    _internal_mutable_type()->::CoreML::Specification::MILSpec::ValueType::MergeFrom(from._internal_type());
  }
  switch (from.value_case()) {
    case kImmediateValue: {
      _internal_mutable_immediatevalue()->::CoreML::Specification::MILSpec::Value_ImmediateValue::MergeFrom(from._internal_immediatevalue());
      break;
    }
    case kBlobFileValue: {
      _internal_mutable_blobfilevalue()->::CoreML::Specification::MILSpec::Value_BlobFileValue::MergeFrom(from._internal_blobfilevalue());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}